

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Atoi64(char *zNum,i64 *pNum,int length,u8 enc)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  uint uVar7;
  undefined7 in_register_00000009;
  byte *pbVar8;
  ulong uVar9;
  ulong uVar10;
  byte *pbVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  
  uVar7 = (uint)CONCAT71(in_register_00000009,enc);
  if (uVar7 == 1) {
    uVar7 = 1;
    bVar3 = false;
    pbVar8 = (byte *)zNum;
  }
  else {
    for (lVar12 = (long)(int)(3 - uVar7);
        (bVar3 = lVar12 < length, lVar12 < length && (zNum[lVar12] == '\0')); lVar12 = lVar12 + 2) {
    }
    length = (uint)lVar12 ^ 1;
    pbVar8 = (byte *)(zNum + (uVar7 & 1));
    uVar7 = 2;
  }
  pbVar11 = (byte *)(zNum + length);
  uVar9 = (ulong)uVar7;
  do {
    bVar4 = true;
    if (pbVar11 <= pbVar8) {
LAB_0012f30d:
      lVar12 = 0;
      for (; (pbVar8 < pbVar11 && (*pbVar8 == 0x30)); pbVar8 = pbVar8 + uVar9) {
        lVar12 = lVar12 - uVar9;
      }
      lVar6 = 0;
      for (lVar13 = 0; (pbVar1 = pbVar8 + lVar13, pbVar1 < pbVar11 && ((byte)(*pbVar1 - 0x30) < 10))
          ; lVar13 = lVar13 + uVar9) {
        lVar6 = lVar6 * 10 + (ulong)*pbVar1 + -0x30;
      }
      lVar15 = -0x8000000000000000;
      lVar14 = -lVar6;
      if (bVar4) {
        lVar15 = 0x7fffffffffffffff;
        lVar14 = lVar6;
      }
      if (lVar6 < 0) {
        lVar14 = lVar15;
      }
      *pNum = lVar14;
      iVar5 = 1;
      if ((pbVar11 <= pbVar1) && (lVar12 != 0 || lVar13 != 0)) {
        if (!bVar3 && (uint)lVar13 <= uVar7 * 0x13) {
          if (uVar7 * 0x13 <= (uint)lVar13) {
            iVar5 = 0;
            pbVar11 = pbVar8;
            for (uVar10 = 0; (iVar5 == 0 && (uVar10 < 0x12)); uVar10 = uVar10 + 1) {
              iVar5 = ((int)(char)*pbVar11 - (int)"922337203685477580"[uVar10]) * 10;
              pbVar11 = pbVar11 + uVar9;
            }
            if (iVar5 == 0) {
              iVar5 = (char)pbVar8[uVar9 * 0x12] + -0x38;
            }
            if (-1 < iVar5) {
              if (iVar5 != 0) {
                return 1;
              }
              return (uint)bVar4 * 2;
            }
          }
          iVar5 = 0;
        }
      }
      return iVar5;
    }
    bVar2 = *pbVar8;
    if ((""[bVar2] & 1) == 0) {
      if (bVar2 == 0x2b) {
        pbVar8 = pbVar8 + uVar9;
      }
      else if (bVar2 == 0x2d) {
        pbVar8 = pbVar8 + uVar9;
        bVar4 = false;
      }
      goto LAB_0012f30d;
    }
    pbVar8 = pbVar8 + uVar9;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3Atoi64(const char *zNum, i64 *pNum, int length, u8 enc){
  int incr;
  u64 u = 0;
  int neg = 0; /* assume positive */
  int i;
  int c = 0;
  int nonNum = 0;  /* True if input contains UTF16 with high byte non-zero */
  const char *zStart;
  const char *zEnd = zNum + length;
  assert( enc==SQLITE_UTF8 || enc==SQLITE_UTF16LE || enc==SQLITE_UTF16BE );
  if( enc==SQLITE_UTF8 ){
    incr = 1;
  }else{
    incr = 2;
    assert( SQLITE_UTF16LE==2 && SQLITE_UTF16BE==3 );
    for(i=3-enc; i<length && zNum[i]==0; i+=2){}
    nonNum = i<length;
    zEnd = &zNum[i^1];
    zNum += (enc&1);
  }
  while( zNum<zEnd && sqlite3Isspace(*zNum) ) zNum+=incr;
  if( zNum<zEnd ){
    if( *zNum=='-' ){
      neg = 1;
      zNum+=incr;
    }else if( *zNum=='+' ){
      zNum+=incr;
    }
  }
  zStart = zNum;
  while( zNum<zEnd && zNum[0]=='0' ){ zNum+=incr; } /* Skip leading zeros. */
  for(i=0; &zNum[i]<zEnd && (c=zNum[i])>='0' && c<='9'; i+=incr){
    u = u*10 + c - '0';
  }
  if( u>LARGEST_INT64 ){
    *pNum = neg ? SMALLEST_INT64 : LARGEST_INT64;
  }else if( neg ){
    *pNum = -(i64)u;
  }else{
    *pNum = (i64)u;
  }
  testcase( i==18 );
  testcase( i==19 );
  testcase( i==20 );
  if( &zNum[i]<zEnd              /* Extra bytes at the end */
   || (i==0 && zStart==zNum)     /* No digits */
   || i>19*incr                  /* Too many digits */
   || nonNum                     /* UTF16 with high-order bytes non-zero */
  ){
    /* zNum is empty or contains non-numeric text or is longer
    ** than 19 digits (thus guaranteeing that it is too large) */
    return 1;
  }else if( i<19*incr ){
    /* Less than 19 digits, so we know that it fits in 64 bits */
    assert( u<=LARGEST_INT64 );
    return 0;
  }else{
    /* zNum is a 19-digit numbers.  Compare it against 9223372036854775808. */
    c = compare2pow63(zNum, incr);
    if( c<0 ){
      /* zNum is less than 9223372036854775808 so it fits */
      assert( u<=LARGEST_INT64 );
      return 0;
    }else if( c>0 ){
      /* zNum is greater than 9223372036854775808 so it overflows */
      return 1;
    }else{
      /* zNum is exactly 9223372036854775808.  Fits if negative.  The
      ** special case 2 overflow if positive */
      assert( u-1==LARGEST_INT64 );
      return neg ? 0 : 2;
    }
  }
}